

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined4 __fd;
  int iVar1;
  __pid_t _Var2;
  __pid_t _Var3;
  int fd;
  int **sv_00;
  int *piVar4;
  ostream *poVar5;
  void *pvVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  size_t __n;
  exception *e;
  string local_158 [8];
  string result_str;
  int i_6;
  undefined1 local_110 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  request;
  char message [64];
  int iStack_b0;
  char buf [1];
  int clientfd_1;
  int i_5;
  undefined1 local_a1;
  int i_4;
  char acStack_9c [3];
  char mesage [1];
  sockaddr_in serv;
  int clientfd;
  int listenfd;
  int i_3;
  int i_2;
  pid_t *worker;
  pid_t masterProc;
  int pid;
  int i_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  table;
  int i;
  int **sv;
  char **argv_local;
  int argc_local;
  
  sv_00 = (int **)operator_new__(0x20);
  for (table._M_h._M_single_bucket._0_4_ = 0; (int)table._M_h._M_single_bucket < 4;
      table._M_h._M_single_bucket._0_4_ = (int)table._M_h._M_single_bucket + 1) {
    piVar4 = (int *)operator_new__(8);
    sv_00[(int)table._M_h._M_single_bucket] = piVar4;
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&pid);
  for (masterProc = 0; masterProc < 4; masterProc = masterProc + 1) {
    iVar1 = socketpair(1,1,0,sv_00[masterProc]);
    if (iVar1 < 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"socketpair");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,masterProc);
      std::operator<<(poVar5,'\n');
      exit(1);
    }
  }
  _Var2 = getpid();
  pvVar6 = mmap((void *)0x0,0x10,3,0x21,-1,0);
  if (pvVar6 != (void *)0x0) {
    memset(pvVar6,0,0x10);
    for (listenfd = 0; listenfd < 4; listenfd = listenfd + 1) {
      _Var3 = getpid();
      if ((_Var3 == _Var2) && (_Var3 = fork(), _Var3 != 0)) {
        if (_Var3 < 0) {
          perror("fork failed");
        }
        else {
          *(__pid_t *)((long)pvVar6 + (long)listenfd * 4) = _Var3;
          sleep(1);
        }
      }
    }
    _Var3 = getpid();
    if (_Var3 != _Var2) {
      iStack_b0 = 0;
      while( true ) {
        if (3 < iStack_b0) {
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&pid);
          return 0;
        }
        _Var2 = getpid();
        if (_Var2 == *(int *)((long)pvVar6 + (long)iStack_b0 * 4)) break;
        iStack_b0 = iStack_b0 + 1;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Work child N ");
      _Var2 = getpid();
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,_Var2);
      std::operator<<(poVar5,'\n');
      workercloser(iStack_b0,sv_00);
      close(sv_00[iStack_b0][1]);
      do {
        message[0x3b] = 'a';
        sock_fd_read(*sv_00[iStack_b0],message + 0x3b,1,(int *)(message + 0x3c));
        recv(message._60_4_,
             &request.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0x40,0x4000);
        poVar5 = std::operator<<((ostream *)&std::cout,"Child proccess N ");
        _Var2 = getpid();
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,_Var2);
        poVar5 = std::operator<<(poVar5," > ");
        poVar5 = std::operator<<(poVar5,(char *)&request.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
        ;
        std::operator<<(poVar5,'\n');
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&i_6,
                   (char *)&request.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (allocator *)(result_str.field_2._M_local_buf + 0xf));
        request_parse((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_110,(string *)&i_6);
        std::__cxx11::string::~string((string *)&i_6);
        std::allocator<char>::~allocator((allocator<char> *)(result_str.field_2._M_local_buf + 0xf))
        ;
        for (result_str.field_2._8_4_ = 0; uVar7 = (ulong)(int)result_str.field_2._8_4_,
            sVar8 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_110), uVar7 < sVar8;
            result_str.field_2._8_4_ = result_str.field_2._8_4_ + 1) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_110,(long)(int)result_str.field_2._8_4_);
          poVar5 = std::operator<<((ostream *)&std::cout,(string *)pvVar9);
          std::operator<<(poVar5,' ');
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"|");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::string(local_158);
        result_message((string *)&e,
                       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&pid,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_110);
        std::__cxx11::string::operator=(local_158,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        poVar5 = std::operator<<((ostream *)&std::cout,"RESULT VALUE ");
        poVar5 = std::operator<<(poVar5,local_158);
        std::operator<<(poVar5,'\n');
        __fd = message._60_4_;
        pvVar6 = (void *)std::__cxx11::string::c_str();
        __n = std::__cxx11::string::length();
        send(__fd,pvVar6,__n,0x4000);
        shutdown(message._60_4_,2);
        close(message._60_4_);
        std::__cxx11::string::~string(local_158);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_110);
      } while( true );
    }
    for (clientfd = 0; clientfd < 4; clientfd = clientfd + 1) {
      close(*sv_00[clientfd]);
    }
    i_4._0_2_ = 2;
    i_4._2_2_ = htons(9000);
    acStack_9c[0] = '\0';
    acStack_9c[1] = '\0';
    acStack_9c[2] = '\0';
    mesage[0] = '\0';
    iVar1 = socket(2,1,0);
    bind(iVar1,(sockaddr *)&i_4,0x10);
    listen(iVar1,5);
    local_a1 = 0x61;
    do {
      for (i_5 = 0; i_5 < 4; i_5 = i_5 + 1) {
        fd = accept(iVar1,(sockaddr *)0x0,(socklen_t *)0x0);
        sock_fd_write(sv_00[i_5][1],&local_a1,1,fd);
        close(fd);
      }
    } while( true );
  }
  perror("mmap failed");
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {


    try{


        int **sv = new int*[4];
        for(int i=0; i<4;i++){
            sv[i] = new int[2];
        }

        std::unordered_map<std::string, std::string> table;
    


        for(int i =0; i <4; i++){
            if(socketpair(AF_LOCAL, SOCK_STREAM, 0, sv[i]) < 0){
                std::cerr <<"socketpair" <<i <<'\n';
                exit(1);
            }
        }

        int pid;

        pid_t masterProc = getpid();

        pid_t *worker;

        worker =(pid_t *)mmap(0, MAX_PIDS*sizeof(pid_t),
                              PROT_READ|PROT_WRITE,
                              MAP_SHARED | MAP_ANONYMOUS, -1, 0);

        if(!worker){
            perror("mmap failed");
            exit(1);
        }

        memset((void *)worker, 0, MAX_PIDS*sizeof(pid_t));

        for(int i =0; i<4; i++){
            if(getpid() == masterProc){
                pid = fork();
                if(pid == 0){
                    continue;
                    //exit(0);
                }else if(pid < 0){
                    perror("fork failed");
                }else{
                    worker[i] = pid;
                    sleep(1);
                }
            }
        }

        if(getpid() == masterProc){

            for(int i=0;i < 4; i++){
                close(sv[i][0]);
            }

            //for(int i =0; i < 4; i++)
            //  printf("this child N %d\n", worker[i]);

            int listenfd, clientfd;

            struct sockaddr_in serv;
            serv.sin_family = AF_INET;
            serv.sin_port = htons(9000);
            serv.sin_addr.s_addr = INADDR_ANY;

            listenfd = socket(AF_INET, SOCK_STREAM, 0);

            bind(listenfd, (struct sockaddr *)&serv, sizeof(serv));

            listen(listenfd, 5);

            char mesage[1] ={'a'};


            while(true){
                for(int i = 0; i < 4 ; i++){
                    clientfd = accept(listenfd,NULL,NULL);
                    sock_fd_write(sv[i][1], mesage, 1, clientfd);
                    close(clientfd);
                    //reload session
                }
            }
            close(listenfd);
            int stat;
            for(int i=0; i < 4 ; i++){
                waitpid(worker[i],&stat,0);
            }


        }

        else{
            for(int i =0; i <4; i++){
                if(getpid() == worker[i]){
                    std::cout << "Work child N " <<getpid() <<'\n';
                    workercloser(i, sv);
                    close(sv[i][1]);

                    int clientfd;


                    for(;;){
                        char buf[1] = {'a'};
                        sock_fd_read(sv[i][0], buf, 1, &clientfd);

                        char message[64];
                        recv(clientfd, message, sizeof(message),
                             MSG_NOSIGNAL);

                     //   std::cout <<"YA PRINAL\n";
                        std::cout << "Child proccess N " <<getpid() << " > "
                                  << message <<'\n';

                        std::vector<std::string> request = request_parse(message);
                        for(int i=0;i < request.size();i++){
                            std::cout <<request[i] <<' ';
                        }std::cout <<"|" <<std::endl;
                        std::string result_str;
                        result_str = result_message(table, request);


                        std::cout << "RESULT VALUE " <<result_str << '\n';
                        send(clientfd, result_str.c_str(), result_str.length(), MSG_NOSIGNAL);

                        shutdown(clientfd, SHUT_RDWR);
                        close(clientfd);
                        //reload session
                    }
                }

            }
        }


    }catch(std::exception &e){
        std::cerr << "Exception " <<e.what() <<std::endl;
    }

    





    return 0;
}